

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::nameinfo::nameinfo(nameinfo *this,uint8_t *p)

{
  ushort uVar1;
  uint32_t uVar2;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  local_60;
  string local_40;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  uVar1 = *(ushort *)p;
  this->_length = uVar1;
  this->_flags = *(uint16_t *)(p + 2);
  if (uVar1 < 5) {
    local_60.field_2._M_allocated_capacity = *(undefined8 *)(p + 4);
    local_60._M_string_length = 4;
    local_60.field_2._M_local_buf[4] = 0;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ToString<unsigned_short>(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
    }
    this->_hash = 0;
    uVar2 = 0;
  }
  else {
    this->_hash = *(uint32_t *)(p + 4);
    uVar2 = *(uint32_t *)(p + 8);
  }
  this->_ptr = uVar2;
  return;
}

Assistant:

nameinfo(const uint8_t *p)
        {
            _length= get16le(p);
            _flags= get16le(p+2);
            if (_length<=4) {
                _name= ToString(std::Wstring((const WCHAR*)(p+4), 4));
                _hash= 0;
                _ptr= 0;
            }
            else {
                _hash= get32le(p+4);
                _ptr= get32le(p+8);
            }
        }